

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,DataType dataType)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  ostringstream source;
  undefined1 auStack_188 [376];
  ulong uVar5;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_188);
  uVar4 = (int)this - 0x2d;
  uVar5 = (ulong)uVar4;
  if (uVar4 < 0x2e) {
    if ((0x102041UL >> (uVar5 & 0x3f) & 1) == 0) {
      if ((0x70000000000U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x380000000000U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_01615db7;
        lVar2 = 0x2b;
        pcVar3 = "GL_OES_texture_storage_multisample_2d_array";
      }
      else {
        lVar2 = 0x15;
        pcVar3 = "GL_EXT_texture_buffer";
      }
    }
    else {
      lVar2 = 0x1d;
      pcVar3 = "GL_EXT_texture_cube_map_array";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,pcVar3,lVar2);
  }
LAB_01615db7:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_188);
  psVar1 = (string *)std::ios_base::~ios_base((ios_base *)(auStack_188 + 0x70));
  return psVar1;
}

Assistant:

std::string getDataTypeExtension (glu::DataType dataType)
{
	std::ostringstream source;
	switch (dataType)
	{
		case glu::TYPE_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW:
		case glu::TYPE_INT_SAMPLER_CUBE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_CUBE_ARRAY:
			source << "GL_EXT_texture_cube_map_array";
			break;

		case glu::TYPE_SAMPLER_BUFFER:
		case glu::TYPE_INT_SAMPLER_BUFFER:
		case glu::TYPE_UINT_SAMPLER_BUFFER:
			source << "GL_EXT_texture_buffer";
			break;

		case glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY:
		case glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY:
			source << "GL_OES_texture_storage_multisample_2d_array";
			break;

		default:
			break;
	}

	return source.str();
}